

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O0

void __thiscall ArgParser::test_exceptions(ArgParser *this)

{
  anon_class_8_1_8991fb9c local_1e0;
  function<void_()> local_1d8;
  anon_class_8_1_8991fb9c local_1b8;
  function<void_()> local_1b0;
  anon_class_8_1_8991fb9c local_190;
  function<void_()> local_188;
  anon_class_8_1_8991fb9c local_168;
  function<void_()> local_160;
  anon_class_8_1_8991fb9c local_140;
  function<void_()> local_138;
  anon_class_8_1_8991fb9c local_118;
  function<void_()> local_110;
  anon_class_8_1_8991fb9c local_f0;
  function<void_()> local_e8;
  anon_class_8_1_8991fb9c local_c8;
  function<void_()> local_c0;
  anon_class_8_1_8991fb9c local_a0;
  function<void_()> local_98;
  anon_class_8_1_8991fb9c local_78;
  function<void_()> local_70;
  anon_class_8_1_8991fb9c local_40;
  function<void_()> local_38;
  anon_class_1_0_00000001 local_11;
  ArgParser *pAStack_10;
  anon_class_1_0_00000001 err;
  ArgParser *this_local;
  
  local_40.this = this;
  pAStack_10 = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__0,void>
            ((function<void()> *)&local_38,&local_40);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"duplicate handler",&local_38);
  std::function<void_()>::~function(&local_38);
  local_78.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__1,void>
            ((function<void()> *)&local_70,&local_78);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"duplicate handler",&local_70);
  std::function<void_()>::~function(&local_70);
  local_a0.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__2,void>
            ((function<void()> *)&local_98,&local_a0);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"duplicate table",&local_98);
  std::function<void_()>::~function(&local_98);
  local_c8.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__3,void>
            ((function<void()> *)&local_c0,&local_c8);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"unknown table",&local_c0);
  std::function<void_()>::~function(&local_c0);
  local_f0.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__4,void>
            ((function<void()> *)&local_e8,&local_f0);
  test_exceptions::anon_class_1_0_00000001::operator()
            (&local_11,"add existing help topic",&local_e8);
  std::function<void_()>::~function(&local_e8);
  local_118.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__5,void>
            ((function<void()> *)&local_110,&local_118);
  test_exceptions::anon_class_1_0_00000001::operator()
            (&local_11,"add reserved help topic",&local_110);
  std::function<void_()>::~function(&local_110);
  local_140.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__6,void>
            ((function<void()> *)&local_138,&local_140);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"add to unknown topic",&local_138);
  std::function<void_()>::~function(&local_138);
  local_168.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__7,void>
            ((function<void()> *)&local_160,&local_168);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"bad option for help",&local_160);
  std::function<void_()>::~function(&local_160);
  local_190.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__8,void>
            ((function<void()> *)&local_188,&local_190);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"bad topic for help",&local_188);
  std::function<void_()>::~function(&local_188);
  local_1b8.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__9,void>
            ((function<void()> *)&local_1b0,&local_1b8);
  test_exceptions::anon_class_1_0_00000001::operator()(&local_11,"duplicate option help",&local_1b0)
  ;
  std::function<void_()>::~function(&local_1b0);
  local_1e0.this = this;
  std::function<void()>::function<ArgParser::test_exceptions()::__10,void>
            ((function<void()> *)&local_1d8,&local_1e0);
  test_exceptions::anon_class_1_0_00000001::operator()
            (&local_11,"invalid choice handler to unknown",&local_1d8);
  std::function<void_()>::~function(&local_1d8);
  return;
}

Assistant:

void
ArgParser::test_exceptions()
{
    auto err = [](char const* msg, std::function<void()> fn) {
        try {
            fn();
            assert(msg == nullptr);
        } catch (std::exception& e) {
            std::cout << msg << ": " << e.what() << std::endl;
        }
    };

    err("duplicate handler", [this]() {
        ap.selectMainOptionTable();
        ap.addBare("potato", []() {});
    });
    err("duplicate handler", [this]() {
        ap.selectOptionTable("baaa");
        ap.addBare("ram", []() {});
    });
    err("duplicate table", [this]() { ap.registerOptionTable("baaa", nullptr); });
    err("unknown table", [this]() { ap.selectOptionTable("aardvark"); });
    err("add existing help topic", [this]() { ap.addHelpTopic("baaa", "potato", "salad"); });
    err("add reserved help topic", [this]() { ap.addHelpTopic("all", "potato", "salad"); });
    err("add to unknown topic", [this]() { ap.addOptionHelp("--new", "oops", "potato", "salad"); });
    err("bad option for help", [this]() { ap.addOptionHelp("nodash", "baaa", "potato", "salad"); });
    err("bad topic for help", [this]() { ap.addHelpTopic("--dashes", "potato", "salad"); });
    err("duplicate option help",
        [this]() { ap.addOptionHelp("--ewe", "baaa", "potato", "salad"); });
    err("invalid choice handler to unknown",
        [this]() { ap.addInvalidChoiceHandler("elephant", [](std::string const&) {}); });
}